

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall
iqxmlrpc::http::Response_header::Response_header(Response_header *this,int c,string *p)

{
  Response_header *this_00;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  Header::Header(&this->super_Header,HTTP_CHECK_WEAK);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_0019cb70;
  *(int *)&(this->super_Header).field_0x8c = c;
  std::__cxx11::string::string((string *)&this->phrase_,(string *)p);
  this_00 = (Response_header *)&names::date;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"date",&local_62);
  current_date_abi_cxx11_(&local_60,this_00);
  Header::set_option(&this->super_Header,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"server",&local_62);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Libiqxmlrpc 0.13.6",&local_61);
  Header::set_option(&this->super_Header,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

Response_header::Response_header( int c, const std::string& p ):
  code_(c),
  phrase_(p)
{
  set_option(names::date, current_date());
  set_option(names::server, PACKAGE " " VERSION);
}